

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM_Command.h
# Opt level: O3

shared_ptr<nigel::IM_SFR> __thiscall nigel::IM_Operator::as<nigel::IM_SFR>(IM_Operator *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  shared_ptr<nigel::IM_SFR> sVar2;
  _func_int **local_20;
  element_type *local_18;
  
  std::__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nigel::IM_Operator,void>
            ((__shared_ptr<nigel::IM_Operator,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (__weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  this->_vptr_IM_Operator = local_20;
  (this->super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_18;
  _Var1._M_pi = extraout_RDX;
  if (local_18 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_18->super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
               super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(local_18->super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
      if (local_18 == (element_type *)0x0) goto LAB_0015c756;
    }
    else {
      *(int *)&(local_18->super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
               super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(local_18->super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
    _Var1._M_pi = extraout_RDX_00;
  }
LAB_0015c756:
  sVar2.super___shared_ptr<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<nigel::IM_SFR>)
         sVar2.super___shared_ptr<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> as()
		{
			return std::static_pointer_cast< T >( shared_from_this() );
		}